

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::updateIsTranslucent(QWidgetPrivate *this)

{
  bool bVar1;
  WidgetAttribute attribute;
  WidgetAttribute WVar2;
  QWidget *this_00;
  long lVar3;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  int newAlpha;
  int oldAlpha;
  QWindow *window;
  QWidget *q;
  QSurfaceFormat format;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  this_00 = (QWidget *)
            QWidget::windowHandle
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (this_00 != (QWidget *)0x0) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x68))(&local_10);
    attribute = QSurfaceFormat::alphaBufferSize();
    bVar1 = QWidget::testAttribute(this_00,attribute);
    WVar2 = ~WA_Disabled;
    if (bVar1) {
      WVar2 = WA_PaintOnScreen;
    }
    if ((attribute != WVar2) && (lVar3 = QWindow::handle(), lVar3 == 0)) {
      QSurfaceFormat::setAlphaBufferSize((int)&local_10);
      QWindow::setFormat((QSurfaceFormat *)this_00);
    }
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::updateIsTranslucent()
{
    Q_Q(QWidget);
    if (QWindow *window = q->windowHandle()) {
        QSurfaceFormat format = window->format();
        const int oldAlpha = format.alphaBufferSize();
        const int newAlpha = q->testAttribute(Qt::WA_TranslucentBackground) ? 8 : -1;
        if (oldAlpha != newAlpha) {
            // QTBUG-85714: Do this only when the QWindow has not yet been create()'ed yet.
            //
            // If that is not the case, then the setFormat() is not just futile
            // but downright dangerous. Futile because the format matters only
            // when creating the native window, no point in changing it
            // afterwards. Dangerous because a QOpenGLContext or something else
            // may eventually query the QWindow's format(), in order to ensure
            // compatibility (in terms of native concepts such as pixel format,
            // EGLConfig, etc.), and if we change it here, then the returned
            // format does not describe reality anymore. (reality being the
            // settings with which the native resource was created).
            //
            // Whereas if one does a destroy()-create() then this all here
            // won't matter because the format is updated in
            // QWidgetPrivate::create() again.
            //
            if (!window->handle()) {
                format.setAlphaBufferSize(newAlpha);
                window->setFormat(format);
            }
        }
    }
}